

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O3

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)6>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  cells *__x;
  SchemeFrame *this;
  runtime_error *this_00;
  bool bVar1;
  __normal_iterator<const_implementations::scheme::cell_*,_std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
  __first;
  string *var;
  env_p new_env;
  cells args;
  cell body;
  cell proc;
  allocator_type local_121;
  vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> local_120;
  env_p local_108;
  env_p local_f8;
  vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_> local_e8;
  cell local_d0;
  cell local_78;
  
  cell::cell(&local_78,it._M_current);
  __first._M_current = it._M_current + 1;
  local_e8.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_78.type == Lambda) {
    if (local_78.list.
        super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
        ._M_impl.super__Vector_impl_data._M_start[1].type == List) {
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      operator=(&local_e8,
                &local_78.list.
                 super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].list);
    }
    else if (local_78.list.
             super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
             ._M_impl.super__Vector_impl_data._M_start[1].type == Symbol) {
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      push_back(&local_e8,
                local_78.list.
                super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                ._M_impl.super__Vector_impl_data._M_start + 1);
      __x = &frame->resolved_arguments;
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      vector(&local_120,__x);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      _M_erase_at_end(__x,(__x->
                          super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      cell::cell(&local_d0,&local_120);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      emplace_back<implementations::scheme::cell>(__x,&local_d0);
      if (local_d0.env.
          super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.env.
                   super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      ~vector(&local_d0.list);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.val._M_dataplus._M_p != &local_d0.val.field_2) {
        operator_delete(local_d0.val._M_dataplus._M_p,local_d0.val.field_2._M_allocated_capacity + 1
                       );
      }
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      ~vector(&local_120);
    }
    cell::cell(&local_d0,
               local_78.list.
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_start + 2);
    local_120.
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x98);
    local_f8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_78.env.
             super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_f8.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_78.env.
         super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_78.env.
        super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78.env.
         super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_78.env.
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78.env.
         super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_78.env.
              super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    environment::environment
              ((environment *)
               local_120.
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_start,&local_f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<implementations::scheme::environment*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_120.
                super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                ._M_impl.super__Vector_impl_data._M_finish,
               (environment *)
               local_120.
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if (local_f8.
        super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.
                 super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (__first._M_current !=
        (frame->resolved_arguments).
        super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      var = &(local_e8.
              super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
              ._M_impl.super__Vector_impl_data._M_start)->val;
      do {
        environment::define((environment *)
                            local_120.
                            super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                            ._M_impl.super__Vector_impl_data._M_start,var,__first._M_current);
        __first._M_current = __first._M_current + 1;
        var = (string *)((long)&var[2].field_2 + 8);
      } while (__first._M_current !=
               (frame->resolved_arguments).
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    frame->subframe_mode = Procedure;
    this = (SchemeFrame *)operator_new(0x138);
    local_108.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             local_120.
             super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_108.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_120.
         super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (local_120.
        super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((local_120.
                   super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->val)._M_dataplus._M_p =
             *(int *)&((local_120.
                        super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->val)._M_dataplus._M_p + 1;
        UNLOCK();
      }
      else {
        *(int *)&((local_120.
                   super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->val)._M_dataplus._M_p =
             *(int *)&((local_120.
                        super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->val)._M_dataplus._M_p + 1;
      }
    }
    SchemeFrame::SchemeFrame(this,&local_d0,&local_108);
    frame->subframe = this;
    if ((pointer)local_108.
                 super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.
                 super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_120.
        super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_120.
                 super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_d0.env.
        super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.env.
                 super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    ~vector(&local_d0.list);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.val._M_dataplus._M_p != &local_d0.val.field_2) {
      operator_delete(local_d0.val._M_dataplus._M_p,local_d0.val.field_2._M_allocated_capacity + 1);
    }
    bVar1 = false;
  }
  else {
    if (local_78.type != Proc) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Dont know how to run this proc");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>::
    vector<__gnu_cxx::__normal_iterator<implementations::scheme::cell_const*,std::vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>>,void>
              ((vector<implementations::scheme::cell,std::allocator<implementations::scheme::cell>>
                *)&local_120,__first,
               (frame->resolved_arguments).
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_121);
    (*local_78.proc)(&local_d0,&local_120);
    (frame->
    super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
    ).result.type = local_d0.type;
    std::__cxx11::string::_M_assign
              ((string *)
               &(frame->
                super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                ).result.val);
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    operator=(&(frame->
               super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
               ).result.list,&local_d0.list);
    (frame->
    super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
    ).result.proc = local_d0.proc;
    (frame->
    super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
    ).result.env.
    super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_d0.env.
         super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(frame->
                super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                ).result.env.
                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &local_d0.env.
                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    if (local_d0.env.
        super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.env.
                 super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    ~vector(&local_d0.list);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.val._M_dataplus._M_p != &local_d0.val.field_2) {
      operator_delete(local_d0.val._M_dataplus._M_p,local_d0.val.field_2._M_allocated_capacity + 1);
    }
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    ~vector(&local_120);
    bVar1 = true;
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_e8);
  if (local_78.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&local_78.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.val._M_dataplus._M_p != &local_78.val.field_2) {
    operator_delete(local_78.val._M_dataplus._M_p,local_78.val.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		cell proc(*it); ++it;

		cells args;
		switch (proc.type) {
		// Proc: a builtin procedure in C++
		// We call this immediately. If it blocks, that is up
		// to the caller.
		case Proc:
			// Copy the rest of the resolved arguments to a new list,
			// that list is passed as the arguments.
			frame.result = proc.proc(cells(it, frame.resolved_arguments.cend()));
			return true;
		// Lambda: a Scheme procedure
		// We create a subframe to run the procedure, along with
		// an environment with arguments set to correct values.
		case Lambda:
		{
			// Arguments
			const cell &arglist = proc.list[1];
			switch (arglist.type) {
			case Symbol:
				// Single argument, assign all args as list
				args.push_back(arglist);
				// Convert resolved arguments to single list
				{
					cells tmp(frame.resolved_arguments);
					frame.resolved_arguments.clear();
					frame.resolved_arguments.push_back(tmp);
				}
				break;
			case List:
				// List of arguments
				args = arglist.list;
				break;
			}
			// Body
			const cell body = proc.list[2];
			// Create environment parented to lambda env
			env_p new_env(new environment(proc.env));
			auto env_arg_it = args.cbegin();
			// assign remaining arguments to our list of argument
			// names in new environment.
			for (; it != frame.resolved_arguments.cend(); ++env_arg_it, ++it) {
				DEBUG(std::string("    set lambda.") + env_arg_it->val + std::string(" = ") + to_string(*it));
				new_env->define(env_arg_it->val, *it);
			}
			// Create subframe
			frame.subframe_mode = SchemeFrame::Procedure;
			frame.subframe = new SchemeFrame(body, new_env);
			// Don't move exp_it
			return false;
		}
		default:
			throw std::runtime_error("Dont know how to run this proc");
		}
	}